

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O3

int nni_msg_realloc(nni_msg *m,size_t sz)

{
  size_t *psVar1;
  int iVar2;
  size_t len;
  
  psVar1 = &(m->m_body).ch_len;
  len = sz - *psVar1;
  if (sz < *psVar1 || len == 0) {
    (m->m_body).ch_len = sz;
  }
  else {
    iVar2 = nni_chunk_append(&m->m_body,(void *)0x0,len);
    if (iVar2 != 0) {
      return iVar2;
    }
  }
  return 0;
}

Assistant:

int
nni_msg_realloc(nni_msg *m, size_t sz)
{
	if (m->m_body.ch_len < sz) {
		int rv =
		    nni_chunk_append(&m->m_body, NULL, sz - m->m_body.ch_len);
		if (rv != 0) {
			return (rv);
		}
	} else {
		// "Shrinking", just mark bytes at end usable again.
		nni_chunk_chop(&m->m_body, m->m_body.ch_len - sz);
	}
	return (0);
}